

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O2

value_type __thiscall
jsoncons::jsonpath::detail::
sum_function<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::evaluate(sum_function<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *this,vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                 *args,error_code *ec)

{
  char *pcVar1;
  bool bVar2;
  iterator this_00;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *pbVar3;
  error_code *in_RCX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar4;
  double dVar5;
  double dVar6;
  array_range_type aVar7;
  value_type vVar8;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> arg0;
  
  pcVar1 = *(char **)ec;
  if ((pointer)(((long)ec->_M_cat - (long)pcVar1) / 0x18) ==
      (args->
      super__Vector_base<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    if (*pcVar1 == '\0') {
      pbVar3 = *(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> **)
                (pcVar1 + 8);
    }
    else {
      pbVar3 = (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
               (pcVar1 + 8);
    }
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::uninitialized_copy
              (&arg0,pbVar3);
    bVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_array
                      (&arg0);
    if (bVar2) {
      aVar7 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
              array_range(&arg0);
      dVar5 = 0.0;
      for (this_00 = aVar7.first_._M_current;
          this_00._M_current != aVar7.last_._M_current._M_current;
          this_00._M_current = this_00._M_current + 1) {
        bVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                is_number(this_00._M_current);
        if (!bVar2) {
          std::error_code::operator=(in_RCX,invalid_type);
          pbVar3 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::null
                             ();
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
          uninitialized_copy((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                              *)this,pbVar3);
          goto LAB_0036cf77;
        }
        dVar6 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                as_double(this_00._M_current);
        dVar5 = dVar5 + dVar6;
      }
      *(undefined2 *)
       &(this->
        super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
        )._vptr_function_base = 5;
      (this->
      super_function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
      ).arg_count_.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload._M_value = (unsigned_long)dVar5;
    }
    else {
      std::error_code::operator=(in_RCX,invalid_type);
      pbVar3 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::null();
      basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::uninitialized_copy
                ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)this,
                 pbVar3);
    }
LAB_0036cf77:
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::~basic_json(&arg0);
    uVar4 = extraout_RDX_00;
  }
  else {
    std::error_code::operator=(in_RCX,invalid_arity);
    pbVar3 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::null();
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::uninitialized_copy
              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)this,
               pbVar3);
    uVar4 = extraout_RDX;
  }
  vVar8.field_0.int64_.val_ = uVar4;
  vVar8.field_0._0_8_ = this;
  return (value_type)vVar8.field_0;
}

Assistant:

value_type evaluate(const std::vector<parameter_type>& args, 
            std::error_code& ec) const override
        {
            if (args.size() != *this->arity())
            {
                ec = jsonpath_errc::invalid_arity;
                return value_type::null();
            }

            auto arg0= args[0].value();
            if (!arg0.is_array())
            {
                //std::cout << "arg: " << arg0 << "\n";
                ec = jsonpath_errc::invalid_type;
                return value_type::null();
            }
            //std::cout << "sum function arg: " << arg0 << "\n";

            double sum = 0;
            for (auto& j : arg0.array_range())
            {
                if (!j.is_number())
                {
                    ec = jsonpath_errc::invalid_type;
                    return value_type::null();
                }
                sum += j.template as<double>();
            }

            return value_type(sum, semantic_tag::none);
        }